

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

Reader __thiscall
capnp::List<capnp::Text,_(capnp::Kind)1>::Reader::operator[](Reader *this,uint index)

{
  StringPtr SVar1;
  PointerReader local_28;
  
  local_28.pointer =
       (WirePointer *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
  local_28.nestingLimit = (this->reader).nestingLimit;
  local_28.segment = (this->reader).segment;
  local_28.capTable = (this->reader).capTable;
  SVar1.content =
       (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_28,(void *)0x0,0);
  return (StringPtr)(StringPtr)SVar1.content;
}

Assistant:

inline typename T::Reader operator[](uint index) const {
      KJ_IREQUIRE(index < size());
      return reader.getPointerElement(bounded(index) * ELEMENTS)
          .template getBlob<T>(nullptr, ZERO * BYTES);
    }